

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrString.h
# Opt level: O3

string<unsigned_short> * __thiscall
irr::core::string<unsigned_short>::operator=
          (string<unsigned_short> *this,string<unsigned_short> *other)

{
  int iVar1;
  unsigned_short *puVar2;
  ulong uVar3;
  long lVar4;
  
  if (this != other) {
    if (this->array != (unsigned_short *)0x0) {
      operator_delete__(this->array);
    }
    iVar1 = other->used;
    lVar4 = (long)iVar1;
    this->used = iVar1;
    this->allocated = iVar1;
    uVar3 = 0xffffffffffffffff;
    if (-1 < lVar4) {
      uVar3 = lVar4 * 2;
    }
    puVar2 = (unsigned_short *)operator_new__(uVar3);
    this->array = puVar2;
    if (0 < lVar4) {
      puVar2 = other->array;
      lVar4 = 0;
      do {
        this->array[lVar4] = puVar2[lVar4];
        lVar4 = lVar4 + 1;
      } while (lVar4 < this->used);
    }
  }
  return this;
}

Assistant:

string<T>& operator=(const string<T>& other) 
	{
		if (this == &other)
			return *this;

		delete [] array;
		allocated = used = other.size()+1;
		array = new T[used];

		const T* p = other.c_str();
		for (s32 i=0; i<used; ++i, ++p)
			array[i] = *p;

		return *this;
	}